

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sunadaptcontroller_mrihtol.c
# Opt level: O0

int SUNAdaptController_Write_MRIHTol(SUNAdaptController C,FILE *fptr)

{
  FILE *in_RSI;
  long *in_RDI;
  SUNContext_conflict sunctx_local_scope_;
  
  fprintf(in_RSI,"Multirate H-Tol SUNAdaptController module:\n");
  fprintf(in_RSI,"  inner_max_relch  = %16g\n",*(undefined8 *)(*in_RDI + 0x10));
  fprintf(in_RSI,"  inner_min_tolfac = %16g\n",*(undefined8 *)(*in_RDI + 0x18));
  fprintf(in_RSI,"  inner_max_tolfac = %16g\n",*(undefined8 *)(*in_RDI + 0x20));
  fprintf(in_RSI,"\nSlow step controller:\n");
  SUNAdaptController_Write(*(undefined8 *)*in_RDI,in_RSI);
  fprintf(in_RSI,"\nFast tolerance controller:\n");
  SUNAdaptController_Write(*(undefined8 *)(*in_RDI + 8),in_RSI);
  return 0;
}

Assistant:

SUNErrCode SUNAdaptController_Write_MRIHTol(SUNAdaptController C, FILE* fptr)
{
  SUNFunctionBegin(C->sunctx);
  SUNAssert(fptr, SUN_ERR_ARG_CORRUPT);
  fprintf(fptr, "Multirate H-Tol SUNAdaptController module:\n");
#if defined(SUNDIALS_EXTENDED_PRECISION)
  fprintf(fptr, "  inner_max_relch  = %32Lg\n", MRIHTOL_INNER_MAX_RELCH(C));
  fprintf(fptr, "  inner_min_tolfac = %32Lg\n", MRIHTOL_INNER_MIN_TOLFAC(C));
  fprintf(fptr, "  inner_max_tolfac = %32Lg\n", MRIHTOL_INNER_MAX_TOLFAC(C));
#else
  fprintf(fptr, "  inner_max_relch  = %16g\n", MRIHTOL_INNER_MAX_RELCH(C));
  fprintf(fptr, "  inner_min_tolfac = %16g\n", MRIHTOL_INNER_MIN_TOLFAC(C));
  fprintf(fptr, "  inner_max_tolfac = %16g\n", MRIHTOL_INNER_MAX_TOLFAC(C));
#endif
  fprintf(fptr, "\nSlow step controller:\n");
  SUNCheckCall(SUNAdaptController_Write(MRIHTOL_CSLOW(C), fptr));
  fprintf(fptr, "\nFast tolerance controller:\n");
  SUNCheckCall(SUNAdaptController_Write(MRIHTOL_CFAST(C), fptr));
  return SUN_SUCCESS;
}